

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O0

void NextChunk(ListChunkTraverseInfo *info,size_t nb,int reverse)

{
  size_t local_28;
  int reverse_local;
  size_t nb_local;
  ListChunkTraverseInfo *info_local;
  
  info->max = info->max - nb;
  if (info->max == 0) {
    if (info->prevDepth == 0x7fffffff) {
      info->list = 0;
    }
    else {
      info->list = info->backtracks[info->prevDepth + -1].list;
      info->max = info->backtracks[info->prevDepth + -1].max;
      if (reverse == 0) {
        local_28 = 0;
      }
      else {
        local_28 = Col_ListLength(info->list);
        local_28 = local_28 - 1;
      }
      info->start = local_28;
      info->prevDepth = info->backtracks[info->prevDepth + -1].prevDepth;
    }
  }
  else if (reverse == 0) {
    info->start = nb + info->start;
  }
  else {
    info->start = info->start - nb;
  }
  return;
}

Assistant:

static void
NextChunk(
    RopeChunkTraverseInfo *info,    /*!< Traversal info. */
    size_t nb,                      /*!< Number of characters to skip. */
    int reverse)                    /*!< Whether to traverse in reverse order.*/
{
    ASSERT(info->max >= nb);
    info->max -= nb;
    if (info->max > 0) {
        /*
         * Still in leaf, advance.
         */

        if (reverse) {
            info->start -= nb;
        } else {
            info->start += nb;
        }
    } else if (info->prevDepth == INT_MAX) {
        /*
         * Already at toplevel => end of rope.
         */

        info->rope = WORD_NIL;
    } else {
        /*
         * Reached leaf bound, backtracks.
         */

        ASSERT(info->backtracks);
        info->rope = info->backtracks[info->prevDepth-1].rope;
        info->max = info->backtracks[info->prevDepth-1].max;
        info->start = (reverse ? Col_RopeLength(info->rope)-1 : 0);
        info->prevDepth = info->backtracks[info->prevDepth-1].prevDepth;
    }
}